

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3BitvecClear(Bitvec *p,u32 i,void *pBuf)

{
  uint uVar1;
  void *in_RDX;
  int in_ESI;
  uint *in_RDI;
  u32 h;
  u32 *aiValues;
  uint j;
  u32 bin;
  uint local_2c;
  uint local_20;
  uint local_c;
  uint *local_8;
  
  if (in_RDI != (uint *)0x0) {
    local_c = in_ESI - 1;
    local_8 = in_RDI;
    do {
      if (local_8[2] == 0) {
        if (*local_8 < 0xf81) {
          *(byte *)((long)local_8 + (ulong)(local_c >> 3) + 0x10) =
               *(byte *)((long)local_8 + (ulong)(local_c >> 3) + 0x10) &
               ((byte)(1 << ((byte)local_c & 7)) ^ 0xff);
          return;
        }
        memcpy(in_RDX,local_8 + 4,0x1f0);
        memset(local_8 + 4,0,0x1f0);
        local_8[1] = 0;
        for (local_20 = 0; local_20 < 0x7c; local_20 = local_20 + 1) {
          if ((*(int *)((long)in_RDX + (ulong)local_20 * 4) != 0) &&
             (*(int *)((long)in_RDX + (ulong)local_20 * 4) != local_c + 1)) {
            local_2c = (*(int *)((long)in_RDX + (ulong)local_20 * 4) - 1U) % 0x7c;
            local_8[1] = local_8[1] + 1;
            while (local_8[(ulong)local_2c + 4] != 0) {
              local_2c = local_2c + 1;
              if (0x7b < local_2c) {
                local_2c = 0;
              }
            }
            local_8[(ulong)local_2c + 4] = *(uint *)((long)in_RDX + (ulong)local_20 * 4);
          }
        }
        return;
      }
      uVar1 = local_c / local_8[2];
      local_c = local_c % local_8[2];
      local_8 = *(uint **)(local_8 + (ulong)uVar1 * 2 + 4);
    } while (local_8 != (uint *)0x0);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3BitvecClear(Bitvec *p, u32 i, void *pBuf){
  if( p==0 ) return;
  assert( i>0 );
  i--;
  while( p->iDivisor ){
    u32 bin = i/p->iDivisor;
    i = i%p->iDivisor;
    p = p->u.apSub[bin];
    if (!p) {
      return;
    }
  }
  if( p->iSize<=BITVEC_NBIT ){
    p->u.aBitmap[i/BITVEC_SZELEM] &= ~(1 << (i&(BITVEC_SZELEM-1)));
  }else{
    unsigned int j;
    u32 *aiValues = pBuf;
    memcpy(aiValues, p->u.aHash, sizeof(p->u.aHash));
    memset(p->u.aHash, 0, sizeof(p->u.aHash));
    p->nSet = 0;
    for(j=0; j<BITVEC_NINT; j++){
      if( aiValues[j] && aiValues[j]!=(i+1) ){
        u32 h = BITVEC_HASH(aiValues[j]-1);
        p->nSet++;
        while( p->u.aHash[h] ){
          h++;
          if( h>=BITVEC_NINT ) h = 0;
        }
        p->u.aHash[h] = aiValues[j];
      }
    }
  }
}